

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall
ON_BinaryArchive::MaskReadError
          (ON_BinaryArchive *this,ON__UINT64 sizeof_request,ON__UINT64 sizeof_read)

{
  if ((this->m_mode & read) != unset_archive_mode) {
    if (sizeof_request == sizeof_read) {
      return true;
    }
    if (sizeof_read <= sizeof_request) {
      if ((this->m_error_message_mask & 4) != 0) {
        return true;
      }
      if (((sizeof_read == 0) && (sizeof_request == 4)) && ((this->m_error_message_mask & 1) != 0))
      {
        return true;
      }
      if ((((this->m_3dm_version == 0) && (this->m_3dm_opennurbs_version == 0)) &&
          ((this->m_3dm_start_section_offset == 0 &&
           ((this->m_3dm_previous_table == Unset && (this->m_3dm_active_table == Unset)))))) &&
         (this->m_3dm_first_failed_table == Unset)) {
        if ((this->m_mode == read3dm) &&
           ((this->m_chunk).m_count < 1 || (this->m_chunk).m_a == (ON_3DM_BIG_CHUNK *)0x0)) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_BinaryArchive::MaskReadError( ON__UINT64 sizeof_request, ON__UINT64 sizeof_read ) const
{
  if ( 0 == (static_cast<unsigned int>(m_mode) % 2 ) )
    return false; // something is seriously wrong

  if ( sizeof_request == sizeof_read )
    return true; // no error

  if ( sizeof_read > sizeof_request )
    return false; // something is seriously wrong

  if ( 0 != (0x04 & m_error_message_mask) )
    return true;

  if (0 != (0x01 & m_error_message_mask) && 4 == sizeof_request && 0 == sizeof_read)
  {
    // when reading v1 files, there are some situations where
    // it is reasonable to attempt to read 4 bytes at the end
    // of a file.
    return true;
  }

  if (0 == m_3dm_version
    && 0 == m_3dm_opennurbs_version
    && 0 == m_3dm_start_section_offset
    && ON_3dmArchiveTableType::Unset == m_3dm_previous_table
    && ON_3dmArchiveTableType::Unset == m_3dm_active_table
    && ON_3dmArchiveTableType::Unset == m_3dm_first_failed_table
    && 0 == m_chunk
    && ON::archive_mode::read3dm == m_mode
    )
  {
    // In Read3dmStartSection(), we search for the string 
    // "3D Geometry File Format ...".  When a non-.3dm file
    // is searched, we eventually reach the end of the file.
    // This error condition is reported by the returning
    // false from ON_BinaryArchive::Read3dmStartSection().
    // ON_ERROR is not called to prevent annoying everyone
    // when the open file dialog is digging around looking
    // for files.
    return true;
  }

  return false; // parial read not permitted at this time.
}